

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPhysicalDeviceImage2DViewOf3DFeaturesEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
          (Impl *this,VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::
      copy<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT_const*,VkPhysicalDeviceImage2DViewOf3DFeaturesEXT*>
                (src,src + count,(VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)this_local);
    }
  }
  return (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}